

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O2

shared_ptr<MyCompiler::Ident> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Ident>(RecursiveDescentParser *this)

{
  socklen_t *in_RCX;
  sockaddr *__addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::Ident> sVar1;
  allocator local_31;
  string local_30;
  
  std::make_shared<MyCompiler::Ident>();
  if (in_RSI->sym != IDENT) {
    std::__cxx11::string::string((string *)&local_30,"identifier expected",&local_31);
    except(in_RSI,IDENT,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  Token::getValue_abi_cxx11_(&in_RSI->currentToken);
  std::__cxx11::string::_M_assign((string *)(this->stream + 0x28));
  accept(in_RSI,in_RSI->sym,__addr,in_RCX);
  sVar1.super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Ident>)
         sVar1.super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Ident> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Ident>();

    if (sym != SymbolType::IDENT)
        except(SymbolType::IDENT, "identifier expected");
    pResult->value = currentToken.getValue();
    accept(sym);

    return pResult;
}